

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::RemoveFlowEdgeToCatchBlock(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  RegionType RVar4;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  LabelInstr *pLVar7;
  Instr *this_00;
  Region *pRVar8;
  FlowEdge *pFVar9;
  bool local_61;
  LabelInstr *catchBlockLabel;
  BranchInstr *branchToCatchBlock;
  BasicBlock *nextBlock;
  LabelInstr *nextLabel;
  Instr *nextInstr;
  BasicBlock *predBlock;
  BasicBlock *catchBlock;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar2 = IR::Instr::IsBranchInstr(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fd1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->m_opcode == BrOnException) {
    pBVar6 = IR::Instr::AsBranchInstr(instr);
    pLVar7 = IR::BranchInstr::GetTarget(pBVar6);
    predBlock = IR::LabelInstr::GetBasicBlock(pLVar7);
    nextInstr = (Instr *)this->currentBlock;
    goto LAB_005b12d8;
  }
  if (instr->m_opcode != BrOnNoException) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fdc,"(instr->m_opcode == Js::OpCode::BrOnNoException)",
                       "instr->m_opcode == Js::OpCode::BrOnNoException");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = IR::Instr::GetNextRealInstrOrLabel(instr);
  IVar3 = IR::Instr::GetKind(this_00);
  local_61 = true;
  if (IVar3 != InstrKindLabel) {
    local_61 = IR::Instr::IsProfiledLabelInstr(this_00);
  }
  if (local_61 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fde,"(nextInstr->IsLabelInstr())","nextInstr->IsLabelInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pLVar7 = IR::Instr::AsLabelInstr(this_00);
  pRVar8 = IR::LabelInstr::GetRegion(pLVar7);
  if (pRVar8 != (Region *)0x0) {
    pRVar8 = IR::LabelInstr::GetRegion(pLVar7);
    RVar4 = Region::GetType(pRVar8);
    if (RVar4 == RegionTypeCatch) {
      predBlock = IR::LabelInstr::GetBasicBlock(pLVar7);
      nextInstr = (Instr *)this->currentBlock;
      goto LAB_005b12d8;
    }
  }
  bVar2 = IR::Instr::IsBranchInstr((pLVar7->super_Instr).m_next);
  if (bVar2) {
    pBVar6 = IR::Instr::AsBranchInstr((pLVar7->super_Instr).m_next);
    bVar2 = IR::BranchInstr::IsUnconditional(pBVar6);
    if (!bVar2) goto LAB_005b11a3;
  }
  else {
LAB_005b11a3:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fe8,
                       "(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional())"
                       ,
                       "nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  nextInstr = (Instr *)IR::LabelInstr::GetBasicBlock(pLVar7);
  pBVar6 = IR::Instr::AsBranchInstr((pLVar7->super_Instr).m_next);
  pLVar7 = IR::BranchInstr::GetTarget(pBVar6);
  pRVar8 = IR::LabelInstr::GetRegion(pLVar7);
  RVar4 = Region::GetType(pRVar8);
  if (RVar4 != RegionTypeCatch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fec,"(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch)",
                       "catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  predBlock = IR::LabelInstr::GetBasicBlock(pLVar7);
LAB_005b12d8:
  if (predBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff2,"(catchBlock)","catchBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (nextInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff3,"(predBlock)","predBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar9 = FlowGraph::FindEdge(this->func->m_fg,(BasicBlock *)nextInstr,predBlock);
  if ((pFVar9 != (FlowEdge *)0x0) &&
     (BasicBlock::RemoveDeadSucc((BasicBlock *)nextInstr,predBlock,this->func->m_fg),
     (BasicBlock *)nextInstr == this->currentBlock)) {
    BasicBlock::DecrementDataUseCount((BasicBlock *)nextInstr);
  }
  return;
}

Assistant:

void
GlobOpt::RemoveFlowEdgeToCatchBlock(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    BasicBlock * catchBlock = nullptr;
    BasicBlock * predBlock = nullptr;
    if (instr->m_opcode == Js::OpCode::BrOnException)
    {
        catchBlock = instr->AsBranchInstr()->GetTarget()->GetBasicBlock();
        predBlock = this->currentBlock;
    }
    else
    {
        Assert(instr->m_opcode == Js::OpCode::BrOnNoException);
        IR::Instr * nextInstr = instr->GetNextRealInstrOrLabel();
        Assert(nextInstr->IsLabelInstr());
        IR::LabelInstr * nextLabel = nextInstr->AsLabelInstr();

        if (nextLabel->GetRegion() && nextLabel->GetRegion()->GetType() == RegionTypeCatch)
        {
            catchBlock = nextLabel->GetBasicBlock();
            predBlock = this->currentBlock;
        }
        else
        {
            Assert(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional());
            BasicBlock * nextBlock = nextLabel->GetBasicBlock();
            IR::BranchInstr * branchToCatchBlock = nextLabel->m_next->AsBranchInstr();
            IR::LabelInstr * catchBlockLabel = branchToCatchBlock->GetTarget();
            Assert(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch);
            catchBlock = catchBlockLabel->GetBasicBlock();
            predBlock = nextBlock;
        }
    }

    Assert(catchBlock);
    Assert(predBlock);
    if (this->func->m_fg->FindEdge(predBlock, catchBlock))
    {
        predBlock->RemoveDeadSucc(catchBlock, this->func->m_fg);
        if (predBlock == this->currentBlock)
        {
            predBlock->DecrementDataUseCount();
        }
    }
}